

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
boost::exception_detail::
clone_impl<boost::exception_detail::error_info_injector<boost::bad_function_call>_>::clone_impl
          (clone_impl<boost::exception_detail::error_info_injector<boost::bad_function_call>_> *this
          ,error_info_injector<boost::bad_function_call> *x)

{
  *(undefined ***)&this->field_0x38 = &PTR___cxa_pure_virtual_001e2098;
  error_info_injector<boost::bad_function_call>::error_info_injector
            (&this->super_error_info_injector<boost::bad_function_call>,x);
  *(undefined8 *)
   &(this->super_error_info_injector<boost::bad_function_call>).super_bad_function_call = 0x1e1ff8;
  (this->super_error_info_injector<boost::bad_function_call>).super_exception._vptr_exception =
       (_func_int **)0x1e2030;
  *(undefined8 *)&this->field_0x38 = 0x1e2068;
  copy_boost_exception
            (&(this->super_error_info_injector<boost::bad_function_call>).super_exception,
             &x->super_exception);
  return;
}

Assistant:

clone_impl( clone_impl const & x, clone_tag ):
                T(x)
                {
                copy_boost_exception(this,&x);
                }